

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker_kernel_1.cpp
# Opt level: O0

int __thiscall dlib::linker::link(linker *this,char *__from,char *__to)

{
  bool bVar1;
  int extraout_EAX;
  ostream *poVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  string *a;
  size_t in_RCX;
  int __how;
  int __how_00;
  int __how_01;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __how_02;
  int __how_03;
  int __how_04;
  int iVar5;
  undefined1 *__stat_loc;
  bool error;
  int status;
  char buf [200];
  ostringstream dlib_o_out;
  linker *in_stack_fffffffffffffc50;
  connection *in_stack_fffffffffffffc58;
  allocator *paVar6;
  string *in_stack_fffffffffffffc60;
  mutex *this_00;
  undefined8 in_stack_fffffffffffffc68;
  error_type eVar7;
  fatal_error *in_stack_fffffffffffffc70;
  _func_void_void_ptr *in_stack_fffffffffffffc78;
  allocator local_2e1;
  string local_2e0 [35];
  byte local_2bd;
  int local_2bc;
  undefined1 local_2b8 [206];
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [39];
  undefined1 local_1c1;
  ostream local_190;
  connection *local_18;
  connection *local_10;
  linker *local_8;
  
  eVar7 = (error_type)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_18 = (connection *)__to;
  local_10 = (connection *)__from;
  local_8 = this;
  bVar1 = is_running(in_stack_fffffffffffffc50);
  if (bVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar2 = std::operator<<(&local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6e);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/linker/linker_kernel_1.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,"void dlib::linker::link(connection &, connection &)");
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"this->is_running() == false");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid linker::link");
    poVar2 = std::operator<<(poVar2,"\n\tis_running() == ");
    bVar1 = is_running(in_stack_fffffffffffffc50);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
    poVar2 = std::operator<<(poVar2,"\n\tthis: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    std::operator<<(poVar2,"\n");
    local_1c1 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffffc70,eVar7,in_stack_fffffffffffffc60);
    local_1c1 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  mutex::lock((mutex *)0x3d6e73);
  this->running = true;
  mutex::unlock((mutex *)0x3d6e88);
  mutex::lock((mutex *)0x3d6e9c);
  this->A = local_10;
  this->B = local_18;
  mutex::unlock((mutex *)0x3d6ecb);
  mutex::lock((mutex *)0x3d6edf);
  this->service_connection_running = true;
  mutex::unlock((mutex *)0x3d6efa);
  mutex::lock((mutex *)0x3d6f0e);
  this->service_connection_error = false;
  mutex::unlock((mutex *)0x3d6f29);
  iVar5 = (int)this;
  bVar1 = create_new_thread(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  if (!bVar1) {
    connection::shutdown(local_10,iVar5,__how);
    eVar7 = (error_type)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    connection::shutdown(local_18,iVar5,__how_00);
    this_00 = &this->service_connection_running_mutex;
    mutex::lock((mutex *)0x3d6f78);
    this->service_connection_running = false;
    mutex::unlock((mutex *)0x3d6f91);
    mutex::lock((mutex *)0x3d6faa);
    this->A = (connection *)0x0;
    this->B = (connection *)0x0;
    mutex::unlock((mutex *)0x3d6fcf);
    mutex::lock((mutex *)0x3d6fe5);
    this->running = false;
    mutex::unlock((mutex *)0x3d6ffb);
    local_1ea = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"failed to make new thread in linker::link()",&local_1e9)
    ;
    thread_error::thread_error((thread_error *)this_00,eVar7,(string *)in_stack_fffffffffffffc50);
    local_1ea = 0;
    __cxa_throw(uVar3,&thread_error::typeinfo,thread_error::~thread_error);
  }
  local_2bd = 0;
  do {
    __stat_loc = local_2b8;
    sVar4 = connection::read(local_10,(int)__stat_loc,(void *)0xc8,in_RCX);
    local_2bc = (int)sVar4;
    iVar5 = __how_01;
    if (local_2bc == -3) {
      local_2bd = 1;
      break;
    }
    if (local_2bc == -4) {
      connection::shutdown(local_18,(int)__stat_loc,__how_01);
      iVar5 = extraout_EDX;
    }
    if (local_2bc < 1) {
      if (local_2bc == 0) {
        connection::shutdown_outgoing(in_stack_fffffffffffffc58);
        iVar5 = extraout_EDX_00;
      }
      break;
    }
    __stat_loc = local_2b8;
    sVar4 = connection::write(local_18,(int)__stat_loc,(void *)(long)local_2bc,in_RCX);
    local_2bc = (int)sVar4;
    iVar5 = extraout_EDX_01;
    if (local_2bc == -3) {
      local_2bd = 1;
      break;
    }
  } while (0 < local_2bc);
  if ((local_2bd & 1) != 0) {
    connection::shutdown(local_10,(int)__stat_loc,iVar5);
    connection::shutdown(local_18,(int)__stat_loc,__how_02);
  }
  mutex::lock((mutex *)0x3d71d9);
  while ((this->service_connection_running & 1U) != 0) {
    signaler::wait(&this->service_connection_running_signaler,__stat_loc);
  }
  mutex::unlock((mutex *)0x3d7214);
  iVar5 = (int)__stat_loc;
  connection::shutdown(local_10,iVar5,__how_03);
  connection::shutdown(local_18,iVar5,__how_04);
  mutex::lock((mutex *)0x3d7242);
  this->A = (connection *)0x0;
  this->B = (connection *)0x0;
  mutex::unlock((mutex *)0x3d7269);
  mutex::lock((mutex *)0x3d727d);
  if ((this->service_connection_error & 1U) != 0) {
    local_2bd = 1;
  }
  mutex::unlock((mutex *)0x3d72aa);
  if ((local_2bd & 1) == 0) {
    mutex::lock((mutex *)0x3d73da);
    this->running = false;
    signaler::broadcast((signaler *)0x3d73ef);
    mutex::unlock((mutex *)0x3d7400);
    return extraout_EAX;
  }
  mutex::lock((mutex *)0x3d72cd);
  this->running = false;
  signaler::broadcast((signaler *)0x3d72e2);
  mutex::unlock((mutex *)0x3d72eb);
  a = (string *)__cxa_allocate_exception(0x30);
  paVar6 = &local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"a connection returned an error in linker::link()",paVar6);
  socket_error::socket_error
            ((socket_error *)in_stack_fffffffffffffc60,(error_type)((ulong)paVar6 >> 0x20),a);
  __cxa_throw(a,&socket_error::typeinfo,socket_error::~socket_error);
}

Assistant:

void linker::
    link (
        connection& a,
        connection& b
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( 
            this->is_running() == false ,
            "\tvoid linker::link"
            << "\n\tis_running() == " << this->is_running() 
            << "\n\tthis: " << this
            );

        running_mutex.lock();
        running = true;
        running_mutex.unlock();

        cons_mutex.lock();
        A = &a;
        B = &b;
        cons_mutex.unlock();

        

        service_connection_running_mutex.lock();
        service_connection_running = true;
        service_connection_running_mutex.unlock();

        service_connection_error_mutex.lock();
        service_connection_error = false;
        service_connection_error_mutex.unlock();

        // if we fail to make the thread
        if (!create_new_thread(service_connection,this))
        {
            a.shutdown();
            b.shutdown();

            service_connection_running_mutex.lock();
            service_connection_running = false;
            service_connection_running_mutex.unlock();

            cons_mutex.lock();
            A = 0;
            B = 0;
            cons_mutex.unlock();  

            running_mutex.lock();
            running = false;
            running_mutex.unlock();



            throw dlib::thread_error (
                ECREATE_THREAD,
                "failed to make new thread in linker::link()"
                );
        }



        // forward data from a to b
        char buf[200];
        int status;
        bool error = false; // becomes true if one of the connections returns an error
        while (true)
        {
            status = a.read(buf,sizeof(buf));
            // if there was an error reading from the socket
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            else if (status == SHUTDOWN)
            {
                b.shutdown();
            }

            if (status <= 0)
            {
                // if a has closed normally
                if (status == 0)
                    b.shutdown_outgoing();
                break;            
            }

            status = b.write(buf,status);
            // if there was an error writing to the socket then break
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            
            if (status <= 0)
                break;            
        }


        // if there was an error then shutdown both connections
        if (error)
        {
            a.shutdown();
            b.shutdown();
        }




        // wait for the other thread to end
        service_connection_running_mutex.lock();
        while(service_connection_running)
        {
            service_connection_running_signaler.wait();
        }
        service_connection_running_mutex.unlock();


        // make sure connections are shutdown
        a.shutdown();
        b.shutdown();


        // both threads have ended so the connections are no longer needed
        cons_mutex.lock();
        A = 0;
        B = 0;
        cons_mutex.unlock();


        // if service_connection terminated due to an error then set error to true
        service_connection_error_mutex.lock();
        if (service_connection_error)
            error = true;
        service_connection_error_mutex.unlock();


        // if we are ending because of an error
        if (error)
        {

            // signal that the link() function is ending
            running_mutex.lock();
            running = false;
            running_signaler.broadcast();
            running_mutex.unlock();

            // throw the exception for this error
            throw dlib::socket_error (
                ECONNECTION,
                "a connection returned an error in linker::link()"
                );
         
        }

        // signal that the link() function is ending
        running_mutex.lock();
        running = false;
        running_signaler.broadcast();
        running_mutex.unlock();
    }